

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereApplyPartialIndexConstraints(Expr *pTruth,int iTabCur,WhereClause *pWC)

{
  int iVar1;
  Expr *pExpr;
  WhereTerm *pTerm;
  int i;
  WhereClause *pWC_local;
  Expr *pEStack_10;
  int iTabCur_local;
  Expr *pTruth_local;
  
  for (pEStack_10 = pTruth; pEStack_10->op == ','; pEStack_10 = pEStack_10->pRight) {
    whereApplyPartialIndexConstraints(pEStack_10->pLeft,iTabCur,pWC);
  }
  pTerm._4_4_ = 0;
  pExpr = (Expr *)pWC->a;
  for (; pTerm._4_4_ < pWC->nTerm; pTerm._4_4_ = pTerm._4_4_ + 1) {
    if ((((ulong)pExpr->pLeft & 0x40000) == 0) &&
       (iVar1 = sqlite3ExprCompare((Parse *)0x0,*(Expr **)pExpr,pEStack_10,iTabCur), iVar1 == 0)) {
      *(ushort *)((long)&pExpr->pLeft + 2) = *(ushort *)((long)&pExpr->pLeft + 2) | 4;
    }
    pExpr = (Expr *)&pExpr->pAggInfo;
  }
  return;
}

Assistant:

static void whereApplyPartialIndexConstraints(
  Expr *pTruth,
  int iTabCur,
  WhereClause *pWC
){
  int i;
  WhereTerm *pTerm;
  while( pTruth->op==TK_AND ){
    whereApplyPartialIndexConstraints(pTruth->pLeft, iTabCur, pWC);
    pTruth = pTruth->pRight;
  }
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    if( pTerm->wtFlags & TERM_CODED ) continue;
    pExpr = pTerm->pExpr;
    if( sqlite3ExprCompare(0, pExpr, pTruth, iTabCur)==0 ){
      pTerm->wtFlags |= TERM_CODED;
    }
  }
}